

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase93::run(TestCase93 *this)

{
  Builder builder_00;
  ArrayPtr<const_capnp::word> *pAVar1;
  SegmentInit *firstElement;
  SegmentInit *ptrCopy;
  ArrayPtr<const_capnp::word> *pAVar2;
  SegmentInit *pSVar3;
  size_t sVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> segments;
  Reader value;
  Array<capnp::MessageBuilder::SegmentInit> segInits;
  TestInitMessageBuilder builder2;
  MallocMessageBuilder builder;
  Builder local_2e8;
  int local_2cc;
  PointerBuilder local_2c8;
  StructBuilder local_2a8;
  SegmentInit *local_278;
  size_t sStack_270;
  undefined8 *local_268;
  WirePointer local_260;
  StructBuilder local_258;
  StructBuilder local_230;
  Fault local_208;
  undefined1 in_stack_fffffffffffffe10 [24];
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,1,FIXED_SIZE);
  MessageBuilder::getRootInternal((Builder *)&local_2a8,&local_120.super_MessageBuilder);
  local_208.exception = (Exception *)local_2a8.segment;
  PointerBuilder::getStruct
            (&local_230,(PointerBuilder *)&local_208,(StructSize)0x140006,(word *)0x0);
  builder_00._builder.capTable = (CapTableBuilder *)local_2a8.data;
  builder_00._builder.segment = (SegmentBuilder *)local_2a8.capTable;
  builder_00._builder.data = (void *)in_stack_fffffffffffffe10._0_8_;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffe10._8_8_;
  builder_00._builder.dataSize = in_stack_fffffffffffffe10._16_4_;
  builder_00._builder.pointerCount = in_stack_fffffffffffffe10._20_2_;
  builder_00._builder._38_2_ = in_stack_fffffffffffffe10._22_2_;
  initTestMessage(builder_00);
  AVar5 = MessageBuilder::getSegmentsForOutput(&local_120.super_MessageBuilder);
  sVar4 = AVar5.size_;
  pAVar1 = AVar5.ptr;
  if (sVar4 == 1) {
    local_2c8.segment = (SegmentBuilder *)CONCAT44(local_2c8.segment._4_4_,1);
    local_2a8.segment = (SegmentBuilder *)0x1;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_long>
              (&local_208,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x67,FAILED,"(1) != (segs.size())","1, segs.size()",(int *)&local_2c8,
               (unsigned_long *)&local_2a8);
    kj::_::Debug::Fault::fatal(&local_208);
  }
  firstElement = (SegmentInit *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x18,0,sVar4,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar3 = firstElement;
  if (sVar4 != 0) {
    pAVar2 = pAVar1 + sVar4;
    do {
      sVar4 = pAVar1->size_;
      (pSVar3->space).ptr = pAVar1->ptr;
      (pSVar3->space).size_ = sVar4;
      pSVar3->wordsUsed = sVar4;
      pSVar3 = pSVar3 + 1;
      pAVar1 = pAVar1 + 1;
    } while (pAVar1 != pAVar2);
  }
  sVar4 = ((long)pSVar3 - (long)firstElement >> 3) * -0x5555555555555555;
  local_268 = &kj::_::HeapArrayDisposer::instance;
  segments.size_ = sVar4;
  segments.ptr = firstElement;
  local_278 = firstElement;
  sStack_270 = sVar4;
  MessageBuilder::MessageBuilder((MessageBuilder *)&local_208,segments);
  local_208.exception = (Exception *)&PTR__TestInitMessageBuilder_0036b2a0;
  MessageBuilder::getRootInternal((Builder *)&local_2c8,(MessageBuilder *)&local_208);
  local_2a8.data = local_2c8.pointer;
  local_2a8.segment = local_2c8.segment;
  local_2a8.capTable = local_2c8.capTable;
  PointerBuilder::getStruct
            (&local_258,(PointerBuilder *)&local_2a8,(StructSize)0x140006,(word *)0x0);
  checkTestMessage((Builder)builder.super_MessageBuilder.arenaSpace._0_40_);
  MessageBuilder::getRootInternal(&local_2e8,(MessageBuilder *)&local_208);
  local_2c8.pointer = local_2e8.builder.pointer;
  local_2c8.segment = local_2e8.builder.segment;
  local_2c8.capTable = local_2e8.builder.capTable;
  PointerBuilder::getStruct(&local_2a8,&local_2c8,(StructSize)0x140006,(word *)0x0);
  ((WirePointer *)((long)local_2a8.data + 8))->offsetAndKind = 0x1e1b9;
  ((WirePointer *)((long)local_2a8.data + 8))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  MessageBuilder::getRootInternal(&local_2e8,&local_120.super_MessageBuilder);
  local_2c8.pointer = local_2e8.builder.pointer;
  local_2c8.segment = local_2e8.builder.segment;
  local_2c8.capTable = local_2e8.builder.capTable;
  PointerBuilder::getStruct(&local_2a8,&local_2c8,(StructSize)0x140006,(word *)0x0);
  if (*(WirePointer *)((long)local_2a8.data + 8) != (WirePointer)0x1e1b9 &&
      kj::_::Debug::minSeverity < 3) {
    local_2cc = 0x1e1b9;
    MessageBuilder::getRootInternal(&local_2e8,&local_120.super_MessageBuilder);
    local_2c8.pointer = local_2e8.builder.pointer;
    local_2c8.segment = local_2e8.builder.segment;
    local_2c8.capTable = local_2e8.builder.capTable;
    PointerBuilder::getStruct(&local_2a8,&local_2c8,(StructSize)0x140006,(word *)0x0);
    local_260 = *(WirePointer *)((long)local_2a8.data + 8);
    kj::_::Debug::log<char_const(&)[79],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x73,ERROR,
               "\"failed: expected \" \"(123321) == (builder.getRoot<TestAllTypes>().getInt64Field())\", 123321, builder.getRoot<TestAllTypes>().getInt64Field()"
               ,(char (*) [79])
                "failed: expected (123321) == (builder.getRoot<TestAllTypes>().getInt64Field())",
               &local_2cc,(long *)&local_260);
  }
  MessageBuilder::getRootInternal(&local_2e8,(MessageBuilder *)&local_208);
  local_2c8.pointer = local_2e8.builder.pointer;
  local_2c8.segment = local_2e8.builder.segment;
  local_2c8.capTable = local_2e8.builder.capTable;
  PointerBuilder::getStruct(&local_2a8,&local_2c8,(StructSize)0x140006,(word *)0x0);
  local_2c8.segment = local_2a8.segment;
  local_2c8.capTable = local_2a8.capTable;
  local_2c8.pointer = local_2a8.pointers;
  value.super_StringPtr.content.size_ = 10;
  value.super_StringPtr.content.ptr = "foobarbaz";
  PointerBuilder::setBlob<capnp::Text>(&local_2c8,value);
  if (kj::_::Debug::minSeverity < 3) {
    local_2a8.segment = (SegmentBuilder *)0x0;
    local_2c8.segment = (SegmentBuilder *)CONCAT44(local_2c8.segment._4_4_,1);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x78,ERROR,
               "\"failed: expected \" \"(1) == (builder2.allocations.size())\", 1, builder2.allocations.size()"
               ,(char (*) [54])"failed: expected (1) == (builder2.allocations.size())",
               (int *)&local_2c8,(unsigned_long *)&local_2a8);
  }
  local_208.exception = (Exception *)&PTR__TestInitMessageBuilder_0036b2a0;
  FlatMessageBuilder::~FlatMessageBuilder((FlatMessageBuilder *)&local_208);
  if (firstElement != (SegmentInit *)0x0) {
    local_278 = (SegmentInit *)0x0;
    sStack_270 = 0;
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,0x18,sVar4,
               sVar4,(_func_void_void_ptr *)0x0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Message, MessageBuilderInitMultiSegment) {
  // Same as previous test, but with a message containing many segments.

  MallocMessageBuilder builder(1, AllocationStrategy::FIXED_SIZE);
  initTestMessage(builder.getRoot<TestAllTypes>());

  // Pull the segments out and make a segment init table out of them.
  //
  // We const_cast for simplicity of implementing the test, but you shouldn't do that at home. :)
  auto segs = builder.getSegmentsForOutput();
  ASSERT_NE(1, segs.size());

  auto segInits = KJ_MAP(seg, segs) -> MessageBuilder::SegmentInit {
    return { kj::arrayPtr(const_cast<word*>(seg.begin()), seg.size()), seg.size() };
  };

  // Init a new builder from the old segments.
  TestInitMessageBuilder builder2(segInits);
  checkTestMessage(builder2.getRoot<TestAllTypes>());

  // Verify that they're really using the same underlying memory.
  builder2.getRoot<TestAllTypes>().setInt64Field(123321);
  EXPECT_EQ(123321, builder.getRoot<TestAllTypes>().getInt64Field());

  // Force builder2 to allocate new space.
  EXPECT_EQ(0, builder2.allocations.size());
  builder2.getRoot<TestAllTypes>().setTextField("foobarbaz");
  EXPECT_EQ(1, builder2.allocations.size());
}